

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECUPort.cc
# Opt level: O1

Bytes * __thiscall
SSM::ECUPort::readBytes(Bytes *__return_storage_ptr__,ECUPort *this,int num_bytes)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  DeviceException *this_00;
  int *piVar4;
  char *__s;
  ReadTimeout *this_01;
  int iVar5;
  int iVar6;
  pointer __buf;
  allocator_type local_71;
  string local_70;
  string local_50;
  
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            (__return_storage_ptr__,(long)num_bytes,&local_71);
  if (0 < num_bytes) {
    iVar1 = *(int *)&(__return_storage_ptr__->
                     super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
    __buf = (__return_storage_ptr__->super__Vector_base<std::byte,_std::allocator<std::byte>_>).
            _M_impl.super__Vector_impl_data._M_start;
    iVar6 = (int)__buf;
    iVar5 = 0;
    do {
      sVar3 = read(this->m_file,__buf,(long)(iVar1 - iVar6));
      uVar2 = (uint)sVar3;
      if ((int)uVar2 < 0) {
        this_00 = (DeviceException *)__cxa_allocate_exception(0x28);
        piVar4 = __errno_location();
        __s = strerror(*piVar4);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,__s,(allocator<char> *)&local_71);
        DeviceException::DeviceException(this_00,&local_50);
        __cxa_throw(this_00,&DeviceException::typeinfo,Exception::~Exception);
      }
      if (uVar2 == 0) {
        this_01 = (ReadTimeout *)__cxa_allocate_exception(0x28);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"Port read timed out","");
        ReadTimeout::ReadTimeout(this_01,&local_70);
        __cxa_throw(this_01,&ReadTimeout::typeinfo,Exception::~Exception);
      }
      __buf = __buf + (uVar2 & 0x7fffffff);
      iVar5 = iVar5 + uVar2;
    } while (iVar5 < num_bytes);
  }
  return __return_storage_ptr__;
}

Assistant:

Bytes ECUPort::readBytes(int num_bytes) const
  {
    Bytes response(num_bytes);
    int bufsize  = sizeof(Bytes::value_type)*response.size();
    int num_read = 0;
    
    Bytes::iterator offset = response.begin();
    while(num_read < num_bytes)
      {
	const int n = read(m_file, &(*offset), bufsize);

	if (n<0) throw(DeviceException(strerror(errno)));
	if (n==0) throw(ReadTimeout("Port read timed out"));

	offset   += n;
	num_read += n;
      }
    return response;
  }